

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawSplineSegmentLinear(Vector2 p1,Vector2 p2,float thick,Color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector2 strip [4];
  Vector2 local_28;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  fVar4 = p2.x;
  fVar5 = p2.y;
  fVar1 = p1.x;
  fVar3 = p1.y;
  fVar6 = fVar4 - fVar1;
  fVar7 = fVar5 - fVar3;
  fVar2 = fVar6 * fVar6 + fVar7 * fVar7;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  if ((0.0 < thick) && (0.0 < fVar2)) {
    fVar2 = thick / (fVar2 + fVar2);
    fVar6 = fVar6 * fVar2;
    fVar7 = fVar7 * -fVar2;
    local_28.x = fVar1 - fVar7;
    local_28.y = fVar3 - fVar6;
    local_20 = fVar1 + fVar7;
    local_1c = fVar3 + fVar6;
    local_18 = fVar4 - fVar7;
    local_14 = fVar5 - fVar6;
    local_10 = fVar7 + fVar4;
    local_c = fVar6 + fVar5;
    DrawTriangleStrip(&local_28,4,color);
  }
  return;
}

Assistant:

void DrawSplineSegmentLinear(Vector2 p1, Vector2 p2, float thick, Color color)
{
    // NOTE: For the linear spline we don't use subdivisions, just a single quad

    Vector2 delta = { p2.x - p1.x, p2.y - p1.y };
    float length = sqrtf(delta.x*delta.x + delta.y*delta.y);

    if ((length > 0) && (thick > 0))
    {
        float scale = thick/(2*length);

        Vector2 radius = { -scale*delta.y, scale*delta.x };
        Vector2 strip[4] = {
            { p1.x - radius.x, p1.y - radius.y },
            { p1.x + radius.x, p1.y + radius.y },
            { p2.x - radius.x, p2.y - radius.y },
            { p2.x + radius.x, p2.y + radius.y }
        };

        DrawTriangleStrip(strip, 4, color);
    }
}